

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.h
# Opt level: O0

void __thiscall libDAI::TreeEP::TreeEP(TreeEP *this)

{
  undefined8 *in_RDI;
  JTree *in_stack_00000010;
  
  JTree::JTree(in_stack_00000010);
  *in_RDI = &PTR_clone_00d4e668;
  in_RDI[0x4c] = 0;
  in_RDI[0x4d] = 0;
  in_RDI[0x4e] = 0;
  in_RDI[0x4f] = 0;
  {unnamed_type#1}::TreeEP((anon_struct_32_4_64d5a170_for_Props2 *)0xb9f439);
  in_RDI[0x50] = 0;
  in_RDI[0x51] = 0;
  memset(in_RDI + 0x52,0,0x30);
  std::
  map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
  ::map((map<unsigned_long,_libDAI::TreeEP::TreeEPSubTree,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_libDAI::TreeEP::TreeEPSubTree>_>_>
         *)0xb9f477);
  return;
}

Assistant:

TreeEP() : JTree(), Props2(), _maxdiff(0.0), _iterations(0UL), _Q() {}